

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O0

ostream * plot::ansi::detail::operator<<(ostream *stream,foreground_setter_24bit *setter)

{
  ostream *poVar1;
  foreground_setter_24bit *setter_local;
  ostream *stream_local;
  
  poVar1 = std::operator<<(stream,"\x1b[38;2;");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(setter->color).r);
  poVar1 = std::operator<<(poVar1,';');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(setter->color).g);
  poVar1 = std::operator<<(poVar1,';');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(setter->color).b);
  poVar1 = std::operator<<(poVar1,'m');
  return poVar1;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, foreground_setter_24bit const& setter) {
            return stream << u8"\x1b[38;2;"
                          << unsigned(setter.color.r) << ';'
                          << unsigned(setter.color.g) << ';'
                          << unsigned(setter.color.b) << 'm';
        }